

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O1

void __thiscall
Am_Priority_List::Change_Second_Third_Priority
          (Am_Priority_List *this,Am_Object *obj,int second_priority,int third_priority)

{
  Am_Priority_List_Item *item;
  ostream *poVar1;
  Am_Object local_30;
  
  Am_Object::Am_Object(&local_30,obj);
  item = take_out_obj(this,&local_30);
  Am_Object::~Am_Object(&local_30);
  if (item != (Am_Priority_List_Item *)0x0) {
    item->second_priority = second_priority;
    item->third_priority = third_priority;
    insert_item_at_right_place(this,item);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar1 = std::operator<<(poVar1,"Change_Second_Third_Priority for ");
  poVar1 = ::operator<<(poVar1,obj);
  poVar1 = std::operator<<(poVar1," but not on list ");
  ::operator<<(poVar1,this);
  std::endl<char,std::char_traits<char>>(poVar1);
  Am_Error();
}

Assistant:

void
Am_Priority_List::Change_Second_Third_Priority(Am_Object obj,
                                               int second_priority,
                                               int third_priority)
{
  Am_Priority_List_Item *item = this->take_out_obj(obj);
  if (!item) {
    Am_ERRORO("Change_Second_Third_Priority for " << obj << " but not on list "
                                                  << *this,
              obj, 0);
  }
  item->second_priority = second_priority;
  item->third_priority = third_priority;
  this->insert_item_at_right_place(item);
}